

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> * __thiscall
ImGuiWS::takeEvents(ImGuiWS *this)

{
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *in_RSI;
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *in_RDI;
  lock_guard<std::mutex> lock;
  type *res;
  
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cc039);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,(mutex_type *)in_RDI);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cc05c);
  std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::deque(in_RSI,in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1cc0ae);
  return in_RDI;
}

Assistant:

std::deque<ImGuiWS::Event> ImGuiWS::takeEvents() {
    std::lock_guard<std::mutex> lock(m_impl->events.mutex);
    auto res = std::move(m_impl->events.data);
    return res;
}